

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

err_t rngSys2Read(void *buf,size_t *read,size_t count)

{
  int iVar1;
  code *pcVar2;
  ulong in_RDX;
  ulong *in_RSI;
  undefined8 in_RDI;
  _func_int_octet_ptr_int *rand_bytes;
  void *lib;
  size_t pos;
  char *names [4];
  long local_58;
  ulong local_50;
  char *local_48 [5];
  ulong local_20;
  ulong *local_18;
  undefined8 local_10;
  err_t local_4;
  
  local_48[0] = "libcrypto.so";
  local_48[1] = "libcrypto.so.3";
  local_48[2] = "libcrypto.so.1.1";
  local_48[3] = "libcrypto.so.1.1.1";
  local_50 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while ((local_50 < 4 && (local_58 = dlopen(local_48[local_50],2), local_58 == 0))) {
    local_50 = local_50 + 1;
  }
  if (local_50 == 4) {
    local_4 = 0xca;
  }
  else {
    *local_18 = 0;
    pcVar2 = (code *)dlsym(local_58,"RAND_bytes");
    if ((pcVar2 == (code *)0x0) || (iVar1 = (*pcVar2)(local_10,local_20 & 0xffffffff), iVar1 != 1))
    {
      dlclose(local_58);
      local_4 = 0x70;
    }
    else {
      dlclose(local_58);
      *local_18 = local_20;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static err_t rngSys2Read(void* buf, size_t* read, size_t count)
{
	const char* names[] = {
		"libcrypto.so", "libcrypto.so.3", "libcrypto.so.1.1",
		"libcrypto.so.1.1.1" };
	size_t pos;
	void* lib;
	int(*rand_bytes)(octet*, int) = 0;
	// pre
	ASSERT(memIsValid(read, sizeof(size_t)));
	ASSERT(memIsValid(buf, count));
	ASSERT((size_t)(int)count == count);
	// пробежать имена
	for (pos = 0; pos < COUNT_OF(names); ++pos)
		if (lib = dlopen(names[pos], RTLD_NOW))
			break;
	if (pos == COUNT_OF(names))
		return ERR_FILE_NOT_FOUND;
	// прочитать случайные данные
	*read = 0;
	rand_bytes = dlsym(lib, "RAND_bytes");
	if (!rand_bytes || rand_bytes(buf, (int)count) != 1)
	{
		dlclose(lib);
		return ERR_NOT_FOUND;
	}
	// завершение
	dlclose(lib);
	*read = count;
	return ERR_OK;
}